

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O2

void __thiscall
EnvironmentROBARM::Create2DStateSpace(EnvironmentROBARM *this,State2D ***statespace2D)

{
  undefined1 auVar1 [16];
  State2D **ppSVar2;
  State2D *pSVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(this->EnvROBARMCfg).EnvWidth_c;
  uVar5 = uVar7 * 8;
  if ((long)uVar7 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppSVar2 = (State2D **)operator_new__(uVar5);
  *statespace2D = ppSVar2;
  for (uVar5 = 0; (long)uVar5 < (long)(int)uVar7; uVar5 = uVar5 + 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->EnvROBARMCfg).EnvHeight_c;
    uVar4 = SUB168(auVar1 * ZEXT816(0xc),0);
    if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pSVar3 = (State2D *)operator_new__(uVar4);
    (*statespace2D)[uVar5] = pSVar3;
    lVar6 = 0;
    for (uVar4 = 0; (long)uVar4 < (long)(int)uVar7; uVar4 = uVar4 + 1) {
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x22])
                (this,(long)&(*statespace2D)[uVar5]->g + lVar6,uVar5 & 0xffff,uVar4 & 0xffff);
      uVar7 = (ulong)(uint)(this->EnvROBARMCfg).EnvWidth_c;
      lVar6 = lVar6 + 0xc;
    }
  }
  return;
}

Assistant:

void EnvironmentROBARM::Create2DStateSpace(State2D*** statespace2D)
{
    int x, y;

    //allocate a statespace for 2D search
    *statespace2D = new State2D*[EnvROBARMCfg.EnvWidth_c];
    for (x = 0; x < EnvROBARMCfg.EnvWidth_c; x++) {
        (*statespace2D)[x] = new State2D[EnvROBARMCfg.EnvHeight_c];
        for (y = 0; y < EnvROBARMCfg.EnvWidth_c; y++) {
            InitializeState2D(&(*statespace2D)[x][y], x, y);
        }
    }
}